

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

void __thiscall
cmCommandArgumentParserHelper::AllocateParserType
          (cmCommandArgumentParserHelper *this,ParserType *pt,char *str,int len)

{
  size_t sVar1;
  char *pcVar2;
  int local_24;
  int len_local;
  char *str_local;
  ParserType *pt_local;
  cmCommandArgumentParserHelper *this_local;
  
  pt->str = (char *)0x0;
  local_24 = len;
  if (len == 0) {
    sVar1 = strlen(str);
    local_24 = (int)sVar1;
  }
  if (local_24 != 0) {
    pcVar2 = (char *)operator_new__((long)(local_24 + 1));
    pt->str = pcVar2;
    strncpy(pt->str,str,(long)local_24);
    pt->str[local_24] = '\0';
    std::vector<char_*,_std::allocator<char_*>_>::push_back(&this->Variables,&pt->str);
  }
  return;
}

Assistant:

void cmCommandArgumentParserHelper::AllocateParserType(
  cmCommandArgumentParserHelper::ParserType* pt, const char* str, int len)
{
  pt->str = CM_NULLPTR;
  if (len == 0) {
    len = static_cast<int>(strlen(str));
  }
  if (len == 0) {
    return;
  }
  pt->str = new char[len + 1];
  strncpy(pt->str, str, len);
  pt->str[len] = 0;
  this->Variables.push_back(pt->str);
}